

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params)

{
  int iVar1;
  AGLFramebuffer fbo;
  
  fbo.name = 0;
  fbo.depth_renderbuffer = 0;
  glGenFramebuffers(1,&fbo);
  glBindFramebuffer(0x8d40,(ulong)fbo & 0xffffffff);
  if (params.color == (AGLTexture *)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x55f,"params.color");
    aAppTerminate(-1);
  }
  else {
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,((params.color)->_).name,0);
  }
  if (params.depth.enable == 0) {
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,0);
  }
  else if (params.depth.texture == (AGLTexture *)0x0) {
    glGenRenderbuffers(1,&fbo.depth_renderbuffer);
    glBindRenderbuffer(0x8d41,fbo.depth_renderbuffer);
    glRenderbufferStorage(0x8d41,0x1902,(params.color)->width,(params.color)->height);
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,fbo.depth_renderbuffer);
    glBindRenderbuffer(0x8d41,0);
  }
  else {
    glFramebufferTexture2D(0x8d40,0x8d00,0xde1,((params.depth.texture)->_).name,0);
  }
  iVar1 = glCheckFramebufferStatus(0x8d40);
  if (iVar1 != 0x8cd5) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x57a,"status == GL_FRAMEBUFFER_COMPLETE");
    aAppTerminate(-1);
  }
  glBindFramebuffer(0x8d40,a__gl_state.framebuffer.binding);
  return fbo;
}

Assistant:

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params) {
	AGLFramebuffer fbo = {0};
	AGL__CALL(glGenFramebuffers(1, &fbo.name));
	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, fbo.name));

	ATTO_ASSERT(params.color);

	if (params.color)
		AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, params.color->_.name, 0));

	if (params.depth.enable) {
		if (params.depth.texture) {
			AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, params.depth.texture->_.name, 0));
		} else {
#ifdef ATTO_GLES
			const GLenum depth_component = GL_DEPTH_COMPONENT16;
#else
			const GLenum depth_component = GL_DEPTH_COMPONENT;
#endif
			AGL__CALL(glGenRenderbuffers(1, &fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glRenderbufferStorage(GL_RENDERBUFFER, depth_component, params.color->width, params.color->height));
			AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER,
				GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		}
	} else {
		// Depth disabled
		AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0));
	}

	const GLenum status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ATTO_ASSERT(status == GL_FRAMEBUFFER_COMPLETE);

	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding));
	return fbo;
}